

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::checkPoint(NavierStokesBase *this,string *dir,ostream *os,How how,bool dump_old)

{
  long lVar1;
  ostream *poVar2;
  IO_Buffer io_buffer;
  string TAFileName;
  ofstream TImeAverageFile;
  long local_208 [3];
  int aiStack_1f0 [120];
  
  amrex::AmrLevel::checkPoint(&this->super_AmrLevel,dir,os,how,dump_old);
  if (0 < avg_interval) {
    std::vector<char,_std::allocator<char>_>::vector
              (&io_buffer.super_vector<char,_std::allocator<char>_>,0x200000,
               (allocator_type *)&TImeAverageFile);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      std::ofstream::ofstream(&TImeAverageFile);
      (**(code **)(local_208[0] + 0x18))
                (local_208,
                 io_buffer.super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,(long)io_buffer.super_vector<char,_std::allocator<char>_>.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::operator+(&TAFileName,dir,"/TimeAverage");
      std::ofstream::open((char *)&TImeAverageFile,(_Ios_Openmode)TAFileName._M_dataplus._M_p);
      lVar1 = *(long *)(_TImeAverageFile + -0x18);
      if (*(int *)((long)aiStack_1f0 + lVar1) != 0) {
        amrex::FileOpenFailed(&TAFileName);
        lVar1 = *(long *)(_TImeAverageFile + -0x18);
      }
      *(undefined8 *)((long)local_208 + lVar1) = 0x11;
      std::operator<<((ostream *)&TImeAverageFile,"Writing time_average to checkpoint\n");
      poVar2 = std::ostream::_M_insert<double>
                         (time_avg.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(this->super_AmrLevel).level]);
      std::operator<<(poVar2,"\n");
      poVar2 = std::ostream::_M_insert<double>
                         (time_avg_fluct.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[(this->super_AmrLevel).level]);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&TAFileName);
      std::ofstream::~ofstream(&TImeAverageFile);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
  }
  return;
}

Assistant:

void
NavierStokesBase::checkPoint (const std::string& dir,
			      std::ostream&      os,
			      VisMF::How         how,
			      bool               dump_old)
{
    AmrLevel::checkPoint(dir, os, how, dump_old);

    if (avg_interval > 0)
    {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

        if (ParallelDescriptor::IOProcessor())
        {
            std::ofstream TImeAverageFile;
            TImeAverageFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
            std::string TAFileName(dir + "/TimeAverage");
            TImeAverageFile.open(TAFileName.c_str(), std::ofstream::out |
                                 std::ofstream::trunc |
                                 std::ofstream::binary);

            if( !TImeAverageFile.good()) {
                amrex::FileOpenFailed(TAFileName);
            }

            TImeAverageFile.precision(17);

            // write out title line
            TImeAverageFile << "Writing time_average to checkpoint\n";

            TImeAverageFile << NavierStokesBase::time_avg[level] << "\n";
            TImeAverageFile << NavierStokesBase::time_avg_fluct[level] << "\n";
        }
    }

#ifdef AMREX_PARTICLES
    if (level == 0)
    {
        if (NSPC != 0)
            NSPC->Checkpoint(dir,the_ns_particle_file_name);
    }
#endif
}